

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_distribution.hpp
# Opt level: O0

result_type __thiscall
boost::random::normal_distribution<double>::operator()
          (normal_distribution<double> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *eng)

{
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *in_RDI;
  result_type rVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  result_type pi;
  double local_38;
  new_uniform_01<double> *in_stack_ffffffffffffffe0;
  uniform_01<double,_double> local_12;
  uniform_01<double,_double> local_11 [17];
  
  if ((in_RDI[10]._x & 1) == 0) {
    uniform_01<double,_double>::uniform_01(local_11);
    rVar1 = detail::new_uniform_01<double>::operator()(in_stack_ffffffffffffffe0,in_RDI);
    *(result_type *)(in_RDI + 4) = rVar1;
    uniform_01<double,_double>::uniform_01(&local_12);
    rVar1 = detail::new_uniform_01<double>::operator()(in_stack_ffffffffffffffe0,in_RDI);
    *(result_type *)(in_RDI + 6) = rVar1;
    dVar2 = log(1.0 - *(double *)(in_RDI + 6));
    dVar2 = sqrt(dVar2 * -2.0);
    *(double *)(in_RDI + 8) = dVar2;
    *(undefined1 *)&in_RDI[10]._x = 1;
  }
  else {
    *(undefined1 *)&in_RDI[10]._x = 0;
  }
  dVar2 = *(double *)(in_RDI + 8);
  if ((in_RDI[10]._x & 1) == 0) {
    local_38 = sin(*(double *)(in_RDI + 4) * 6.283185307179586);
  }
  else {
    local_38 = cos(*(double *)(in_RDI + 4) * 6.283185307179586);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(in_RDI + 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)in_RDI;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar2 * local_38;
  auVar3 = vfmadd213sd_fma(auVar3,auVar4,auVar5);
  return auVar3._0_8_;
}

Assistant:

result_type operator()(Engine& eng)
    {
        using std::sqrt;
        using std::log;
        using std::sin;
        using std::cos;

        if(!_valid) {
            _r1 = boost::uniform_01<RealType>()(eng);
            _r2 = boost::uniform_01<RealType>()(eng);
            _cached_rho = sqrt(-result_type(2) * log(result_type(1)-_r2));
            _valid = true;
        } else {
            _valid = false;
        }
        // Can we have a boost::mathconst please?
        const result_type pi = result_type(3.14159265358979323846);

        return _cached_rho * (_valid ?
                              cos(result_type(2)*pi*_r1) :
                              sin(result_type(2)*pi*_r1))
            * _sigma + _mean;
    }